

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackTest.cpp
# Opt level: O1

int main(void)

{
  undefined1 *this;
  pointer *ppvVar1;
  undefined4 uVar2;
  ostream *poVar3;
  undefined2 *puVar4;
  _func_int **pp_Var5;
  undefined2 *puVar6;
  int i;
  int iVar7;
  undefined1 auStack_248 [8];
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  std_3;
  stack<int,_std::deque<int,_std::allocator<int>_>_> std_2;
  undefined1 local_1a0 [8];
  stack<char,_ft::deque<char,_ft::allocator<char>_>_> ft;
  stack<char,_std::deque<char,_std::allocator<char>_>_> std;
  undefined1 local_a8 [8];
  stack<int,_ft::deque<int,_ft::allocator<int>_>_> ft_2;
  
  ft.c._112_8_ = 0;
  ::std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map
            ((_Deque_base<char,_std::allocator<char>_> *)&ft.c.field_0x70,0);
  local_a8 = (undefined1  [8])&PTR__dequeIterator_0010ebc8;
  ft_2.c.m_start.m_node = (map_pointer)&PTR__dequeIterator_0010ebc8;
  ft_2.c.m_finish.m_node = (map_pointer)0x0;
  ft_2.c.m_map = (map_pointer)0x0;
  ft_2.c.m_map_size = 0;
  ft_2.c.m_chunks = 0;
  ::ft::deque<char,_ft::allocator<char>_>::dequeInit
            ((deque<char,_ft::allocator<char>_> *)local_a8,0);
  ::ft::deque<char,_ft::allocator<char>_>::deque
            ((deque<char,_ft::allocator<char>_> *)local_1a0,
             (deque<char,_ft::allocator<char>_> *)local_a8);
  ::ft::deque<char,_ft::allocator<char>_>::~deque((deque<char,_ft::allocator<char>_> *)local_a8);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"std is empty",0xc);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x50);
  ::std::ostream::put(-0x50);
  ::std::ostream::flush();
  if (ft.c.m_chunks == 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout," ft is empty",0xc)
    ;
    ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x50);
    ::std::ostream::put(-0x50);
    ::std::ostream::flush();
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,"size of std is: ",0x10);
  poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  ::std::ostream::put((char)poVar3);
  ::std::ostream::flush();
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,"size of ft  is: ",0x10);
  poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  ::std::ostream::put((char)poVar3);
  ::std::ostream::flush();
  ::ft::deque<char,_ft::allocator<char>_>::~deque((deque<char,_ft::allocator<char>_> *)local_1a0);
  this = &ft.c.field_0x70;
  ::std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            ((_Deque_base<char,_std::allocator<char>_> *)this);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"---",3);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x50);
  ::std::ostream::put(-0x50);
  ::std::ostream::flush();
  ft.c._112_8_ = 0;
  ::std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map
            ((_Deque_base<double,_std::allocator<double>_> *)&ft.c.field_0x70,0);
  local_a8 = (undefined1  [8])&PTR__dequeIterator_0010ec48;
  ft_2.c.m_start.m_node = (map_pointer)&PTR__dequeIterator_0010ec48;
  ft_2.c.m_finish.m_node = (map_pointer)0x0;
  ft_2.c.m_map = (map_pointer)0x0;
  ft_2.c.m_map_size = 0;
  ft_2.c.m_chunks = 0;
  ::ft::deque<double,_ft::allocator<double>_>::dequeInit
            ((deque<double,_ft::allocator<double>_> *)local_a8,0);
  ::ft::deque<double,_ft::allocator<double>_>::deque
            ((deque<double,_ft::allocator<double>_> *)local_1a0,
             (deque<double,_ft::allocator<double>_> *)local_a8);
  ::ft::deque<double,_ft::allocator<double>_>::~deque
            ((deque<double,_ft::allocator<double>_> *)local_a8);
  iVar7 = 1;
  do {
    local_a8 = (undefined1  [8])((double)iVar7 / 3.0);
    ::std::deque<double,_std::allocator<double>_>::emplace_back<double>
              ((deque<double,_std::allocator<double>_> *)this,(double *)local_a8);
    local_a8 = (undefined1  [8])((double)iVar7 / 3.0);
    ::ft::deque<double,_ft::allocator<double>_>::push_back
              ((deque<double,_ft::allocator<double>_> *)local_1a0,(value_type_conflict1 *)local_a8);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 8);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,"size of std is: ",0x10);
  poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  ::std::ostream::put((char)poVar3);
  ::std::ostream::flush();
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,"size of ft  is: ",0x10);
  poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  ::std::ostream::put((char)poVar3);
  ::std::ostream::flush();
  print<std::stack<double,std::deque<double,std::allocator<double>>>>
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&ft.c.field_0x70,"std");
  print<ft::stack<double,ft::deque<double,ft::allocator<double>>>>
            ((stack<double,_ft::deque<double,_ft::allocator<double>_>_> *)local_1a0,"ft");
  ::ft::deque<double,_ft::allocator<double>_>::~deque
            ((deque<double,_ft::allocator<double>_> *)local_1a0);
  ::std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
            ((_Deque_base<double,_std::allocator<double>_> *)&ft.c.field_0x70);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"---",3);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x50);
  ::std::ostream::put(-0x50);
  ::std::ostream::flush();
  std.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  ft.c._112_8_ = 0;
  ::std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&ft.c.field_0x70,0);
  local_a8 = (undefined1  [8])&PTR__dequeIterator_0010ecc8;
  ft_2.c.m_start.m_node = (map_pointer)&PTR__dequeIterator_0010ecc8;
  ft_2.c.m_finish.m_node = (map_pointer)0x0;
  ft_2.c.m_map = (map_pointer)0x0;
  ft_2.c.m_map_size = 0;
  ft_2.c.m_chunks = 0;
  ::ft::deque<int,_ft::allocator<int>_>::dequeInit((deque<int,_ft::allocator<int>_> *)local_a8,0);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_1a0,
             (deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  local_a8._0_4_ = 1;
  iVar7 = 1;
  do {
    if (std.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data._M_start
        ._M_node == (_Map_pointer)0xfffffffffffffffc) {
      ::std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)&ft.c.field_0x70,(int *)local_a8);
    }
    else {
      *(int *)std.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
              _M_start._M_node = iVar7;
      std.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data._M_start.
      _M_node = (_Map_pointer)
                ((long)std.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node + 4);
    }
    ::ft::deque<int,_ft::allocator<int>_>::push_back
              ((deque<int,_ft::allocator<int>_> *)local_1a0,(value_type *)local_a8);
    uVar2 = local_a8._0_4_;
    iVar7 = local_a8._0_4_ + 1;
    local_a8._0_4_ = iVar7;
  } while ((int)uVar2 < 5);
  ::std::deque<int,_std::allocator<int>_>::deque
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (deque<int,_std::allocator<int>_> *)&ft.c.field_0x70);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (deque<int,_ft::allocator<int>_> *)local_1a0);
  print<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,"std");
  print<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ft");
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_1a0);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&ft.c.field_0x70);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"---",3);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x50);
  ::std::ostream::put(-0x50);
  ::std::ostream::flush();
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ::std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&std_3.c.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node,0);
  local_a8 = (undefined1  [8])&PTR__dequeIterator_0010ed48;
  ft_2.c.m_start.m_node = (map_pointer)&PTR__dequeIterator_0010ed48;
  ft_2.c.m_finish.m_node = (map_pointer)0x0;
  ft_2.c.m_map = (map_pointer)0x0;
  ft_2.c.m_map_size = 0;
  ft_2.c.m_chunks = 0;
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::dequeInit((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8,0);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_1a0,
          (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_a8);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a8);
  ppvVar1 = &ft_2.c.m_start.m_cur;
  local_a8 = (undefined1  [8])ppvVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"what\'s","");
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  if (local_a8 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_a8,(long)ft_2.c.m_start.m_cur + 1);
  }
  local_a8 = (undefined1  [8])ppvVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"in","");
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  if (local_a8 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_a8,(long)ft_2.c.m_start.m_cur + 1);
  }
  local_a8 = (undefined1  [8])ppvVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"the","");
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  if (local_a8 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_a8,(long)ft_2.c.m_start.m_cur + 1);
  }
  local_a8 = (undefined1  [8])ppvVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"fucking","");
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  if (local_a8 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_a8,(long)ft_2.c.m_start.m_cur + 1);
  }
  local_a8 = (undefined1  [8])ppvVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"box","");
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  if (local_a8 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_a8,(long)ft_2.c.m_start.m_cur + 1);
  }
  local_a8 = (undefined1  [8])ppvVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"what\'s","");
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0,(value_type *)local_a8);
  if (local_a8 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_a8,(long)ft_2.c.m_start.m_cur + 1);
  }
  local_a8 = (undefined1  [8])ppvVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"in","");
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0,(value_type *)local_a8);
  if (local_a8 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_a8,(long)ft_2.c.m_start.m_cur + 1);
  }
  local_a8 = (undefined1  [8])ppvVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"the","");
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0,(value_type *)local_a8);
  if (local_a8 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_a8,(long)ft_2.c.m_start.m_cur + 1);
  }
  local_a8 = (undefined1  [8])ppvVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"fucking","");
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0,(value_type *)local_a8);
  if (local_a8 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_a8,(long)ft_2.c.m_start.m_cur + 1);
  }
  local_a8 = (undefined1  [8])ppvVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"box","");
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0,(value_type *)local_a8);
  if (local_a8 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_a8,(long)ft_2.c.m_start.m_cur + 1);
  }
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_248 = (undefined1  [8])0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  ::std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_248,0);
  ft.c._112_8_ = &PTR__dequeIterator_0010ed48;
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::dequeInit((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ft.c.field_0x70,0);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_a8,
          (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&ft.c.field_0x70);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ft.c.field_0x70);
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_248,
              (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&std_3.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8,
              (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0);
  print<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)auStack_248,"std");
  print<ft::stack<std::__cxx11::string,ft::deque<std::__cxx11::string,ft::allocator<std::__cxx11::string>>>>
            ((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_a8,"ft");
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a8);
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_248);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1a0);
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&std_3.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"---",3);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x50);
  ::std::ostream::put(-0x50);
  ::std::ostream::flush();
  puVar4 = (undefined2 *)operator_new(3);
  *puVar4 = 0x7e7e;
  *(undefined1 *)(puVar4 + 1) = 0x7e;
  local_1a0 = (undefined1  [8])0x0;
  ft.c.m_start._vptr_dequeIterator = (_func_int **)0x3;
  ft.c.m_start.m_cur = (pointer)0x3;
  local_1a0 = (undefined1  [8])operator_new(3);
  if (ft.c.m_start._vptr_dequeIterator != (_func_int **)0x0) {
    pp_Var5 = (_func_int **)0x0;
    do {
      *(undefined1 *)((long)local_1a0 + (long)pp_Var5) = 0x7e;
      pp_Var5 = (_func_int **)((long)pp_Var5 + 1);
    } while (pp_Var5 < ft.c.m_start._vptr_dequeIterator);
  }
  ft.c._112_8_ = 0;
  puVar6 = (undefined2 *)operator_new(3);
  *(undefined1 *)(puVar6 + 1) = *(undefined1 *)(puVar4 + 1);
  *puVar6 = *puVar4;
  ft.c._112_8_ = puVar6;
  ::ft::vector<char,_ft::allocator<char>_>::vector
            ((vector<char,_ft::allocator<char>_> *)local_a8,
             (vector<char,_ft::allocator<char>_> *)local_1a0);
  print<std::stack<char,std::vector<char,std::allocator<char>>>>
            ((stack<char,_std::vector<char,_std::allocator<char>_>_> *)&ft.c.field_0x70,"std");
  print<ft::stack<char,ft::vector<char,ft::allocator<char>>>>
            ((stack<char,_ft::vector<char,_ft::allocator<char>_>_> *)local_a8,"ft");
  operator_delete((void *)local_a8);
  if (ft.c._112_8_ != 0) {
    operator_delete((void *)ft.c._112_8_,(long)puVar6 + (3 - ft.c._112_8_));
  }
  operator_delete((void *)local_1a0);
  operator_delete(puVar4,3);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"---",3);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + -0x50);
  ::std::ostream::put(-0x50);
  ::std::ostream::flush();
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ::std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,0);
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_248 = (undefined1  [8])0x0;
  std_3.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  ::std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_248,0);
  local_a8 = (undefined1  [8])&PTR__dequeIterator_0010ecc8;
  ft_2.c.m_start.m_node = (map_pointer)&PTR__dequeIterator_0010ecc8;
  ft_2.c.m_finish.m_node = (map_pointer)0x0;
  ft_2.c.m_map = (map_pointer)0x0;
  ft_2.c.m_map_size = 0;
  ft_2.c.m_chunks = 0;
  ::ft::deque<int,_ft::allocator<int>_>::dequeInit((deque<int,_ft::allocator<int>_> *)local_a8,0);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_1a0,
             (deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ft.c._112_8_ = &PTR__dequeIterator_0010ecc8;
  ::ft::deque<int,_ft::allocator<int>_>::dequeInit
            ((deque<int,_ft::allocator<int>_> *)&ft.c.field_0x70,0);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (deque<int,_ft::allocator<int>_> *)&ft.c.field_0x70);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)&ft.c.field_0x70)
  ;
  ft.c._112_4_ = 5;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,(int *)&ft.c.field_0x70);
  ft.c._112_4_ = 5;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)auStack_248,(int *)&ft.c.field_0x70);
  ft.c._112_4_ = 5;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_1a0,(value_type *)&ft.c.field_0x70);
  ft.c._112_4_ = 5;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,(value_type *)&ft.c.field_0x70);
  ft.c._112_4_ = 0xb;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,(int *)&ft.c.field_0x70);
  ft.c._112_4_ = 0xb;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)auStack_248,(int *)&ft.c.field_0x70);
  ft.c._112_4_ = 0xb;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_1a0,(value_type *)&ft.c.field_0x70);
  ft.c._112_4_ = 0xb;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,(value_type *)&ft.c.field_0x70);
  ft.c._112_4_ = 0x13;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,(int *)&ft.c.field_0x70);
  ft.c._112_4_ = 0x13;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)auStack_248,(int *)&ft.c.field_0x70);
  ft.c._112_4_ = 0x13;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_1a0,(value_type *)&ft.c.field_0x70);
  ft.c._112_4_ = 0x13;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,(value_type *)&ft.c.field_0x70);
  relational_operator<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,"stdFoo",
             (stack<int,_std::deque<int,_std::allocator<int>_>_> *)auStack_248,"stdBar");
  relational_operator<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_1a0,"ftFoo",
             (stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ftBar");
  operator_delete((void *)0x0,0x200);
  ft.c._112_4_ = 0x15;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,(int *)&ft.c.field_0x70);
  if (ft.c.m_finish._vptr_dequeIterator == (_func_int **)ft.c.m_finish.m_cur) {
    ft.c.m_finish.m_cur = *(pointer *)(ft.c.m_finish.m_last + -8);
    ft.c.m_finish._vptr_dequeIterator = (_func_int **)(ft.c.m_finish.m_cur + 0x100);
    ft.c.m_finish.m_first = (pointer)ft.c.m_finish._vptr_dequeIterator;
    ft.c.m_finish.m_last = ft.c.m_finish.m_last + -8;
  }
  ft.c.m_finish._vptr_dequeIterator = (_func_int **)((long)ft.c.m_finish._vptr_dequeIterator + -4);
  ft.c.m_chunks = ft.c.m_chunks - 1;
  ft.c._112_4_ = 0x15;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_1a0,(value_type *)&ft.c.field_0x70);
  relational_operator<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,"stdFoo",
             (stack<int,_std::deque<int,_std::allocator<int>_>_> *)auStack_248,"stdBar");
  relational_operator<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_1a0,"ftFoo",
             (stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ftBar");
  if ((_Elt_pointer)
      std_3.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      std_3.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    operator_delete(std_3.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur,0x200);
    std_3.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur =
         *(_Elt_pointer *)
          ((long)&std_3.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].field_2 + 8);
    std_3.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first =
         std_3.c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur + 0x10;
    std_3.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node =
         (_Map_pointer)
         ((long)&std_3.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur[0xf].field_2 + 0xc);
    std_3.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last =
         (_Elt_pointer)
         ((long)&std_3.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].field_2 + 8);
  }
  else {
    std_3.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node =
         (_Map_pointer)
         ((long)std_3.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node + -4);
  }
  ft.c._112_4_ = 0x15;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)auStack_248,(int *)&ft.c.field_0x70);
  ft.c._112_4_ = 3;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)auStack_248,(int *)&ft.c.field_0x70);
  if (ft_2.c.m_finish._vptr_dequeIterator == (_func_int **)ft_2.c.m_finish.m_cur) {
    ft_2.c.m_finish.m_cur = *(pointer *)(ft_2.c.m_finish.m_last + -2);
    ft_2.c.m_finish._vptr_dequeIterator = (_func_int **)(ft_2.c.m_finish.m_cur + 0x40);
    ft_2.c.m_finish.m_first = (pointer)ft_2.c.m_finish._vptr_dequeIterator;
    ft_2.c.m_finish.m_last = ft_2.c.m_finish.m_last + -2;
  }
  ft_2.c.m_finish._vptr_dequeIterator =
       (_func_int **)((long)ft_2.c.m_finish._vptr_dequeIterator + -4);
  ft_2.c.m_chunks = ft_2.c.m_chunks - 1;
  ft.c._112_4_ = 0x15;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,(value_type *)&ft.c.field_0x70);
  ft.c._112_4_ = 3;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,(value_type *)&ft.c.field_0x70);
  relational_operator<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,"stdFoo",
             (stack<int,_std::deque<int,_std::allocator<int>_>_> *)auStack_248,"stdBar");
  relational_operator<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_1a0,"ftFoo",
             (stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ftBar");
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_1a0);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_248);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_3.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return 0;
}

Assistant:

int 	main() {
	{ // constructors and some basic functions
		std::stack<char>	std;
		ft::stack<char>		ft;

		if (std.empty()) std::cout << "std is empty" << std::endl;
		if (ft.empty()) std::cout << " ft is empty" << std::endl;

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;
	}

	std::cout << "---" << std::endl;

	{ // push pop and top
		std::stack<double>	std;
		ft::stack<double>	ft;

		for (int i = 1; i <= 7; ++i) {
			std.push(i / 3.0);
			ft.push(i / 3.0);
		}

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // copy constructor
		std::stack<int>	stdCopy;
		ft::stack<int>	ftCopy;

		for (int i = 1; i <= 5; ++i) {
			stdCopy.push(i);
			ftCopy.push(i);
		}

		std::stack<int>	std(stdCopy);
		ft::stack<int>	ft(ftCopy);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // assignment operator
		std::stack<std::string>	stdCopy;
		ft::stack<std::string>	ftCopy;

		stdCopy.push("what's");
		stdCopy.push("in");
		stdCopy.push("the");
		stdCopy.push("fucking");
		stdCopy.push("box");

		ftCopy.push("what's");
		ftCopy.push("in");
		ftCopy.push("the");
		ftCopy.push("fucking");
		ftCopy.push("box");

		std::stack<std::string>	std;
		ft::stack<std::string>	ft;

		std = stdCopy;
		ft = ftCopy;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // different underlying container
		std::vector<char>	stdL(3, '~');
		ft::vector<char>	ftL(3, '~');

		std::stack<char, std::vector<char> >	std(stdL);
		ft::stack<char, ft::vector<char> >		ft(ftL);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // relational operators
		std::stack<int>	stdFoo, stdBar;
		ft::stack<int>	ftFoo, ftBar;

		stdFoo.push(5);
		stdBar.push(5);
		ftFoo.push(5);
		ftBar.push(5);

		stdFoo.push(11);
		stdBar.push(11);
		ftFoo.push(11);
		ftBar.push(11);

		stdFoo.push(19);
		stdBar.push(19);
		ftFoo.push(19);
		ftBar.push(19);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdFoo.pop();
		stdFoo.push(21);
		ftFoo.pop();
		ftFoo.push(21);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdBar.pop();
		stdBar.push(21);
		stdBar.push(3);
		ftBar.pop();
		ftBar.push(21);
		ftBar.push(3);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);
	}
	return 0;
}